

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O3

void __thiscall Samba::program(Samba *this,uint32_t dst,uint32_t src)

{
  SerialPort *pSVar1;
  int iVar2;
  undefined8 *puVar3;
  uint8_t Pause;
  uint8_t cmd [20];
  undefined1 local_39;
  char local_38 [32];
  
  local_39 = 0x20;
  if (this->_debug == true) {
    printf("%s(dst=%#x,src=%#x)\n","program",(ulong)dst,(ulong)src);
  }
  snprintf(local_38,0x14,"y%08X,%08X#",(ulong)dst,(ulong)src);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  iVar2 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,&local_39,1);
  if (iVar2 == 1) {
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    iVar2 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,local_38,0x13);
    if (iVar2 == 0x13) {
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[9])(pSVar1,5000);
      local_38[0] = '\0';
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[5])(pSVar1,local_38,3);
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[9])(pSVar1,1000);
      if (local_38[0] == 'Y') {
        return;
      }
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_001185a0;
  __cxa_throw(puVar3,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::program(uint32_t dst, uint32_t src)
{
    uint8_t cmd[20];
    uint8_t Pause = ' ';

    if (_debug)
        printf("%s(dst=%#x,src=%#x)\n", __FUNCTION__, dst, src);

    snprintf((char*) cmd, sizeof(cmd), "y%08X,%08X#", dst, src);

    
    if (_port->write(&Pause, 1) != 1)
        throw SambaError();

    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();

  

     _port->timeout(TIMEOUT_LONG);
      cmd[0] = 0;
     _port->read(cmd, 3);
     _port->timeout(TIMEOUT_NORMAL);


     if(cmd[0] == 'Y')
     {
        return;
     }else{
         throw SambaError();
     }
   
}